

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O0

void SubprocessSet::HandlePendingInterruption(void)

{
  int iVar1;
  undefined1 local_88 [8];
  sigset_t pending;
  
  sigemptyset((sigset_t *)local_88);
  iVar1 = sigpending((sigset_t *)local_88);
  if (iVar1 == -1) {
    perror("ninja: sigpending");
  }
  else {
    iVar1 = sigismember((sigset_t *)local_88,2);
    if (iVar1 == 0) {
      iVar1 = sigismember((sigset_t *)local_88,0xf);
      if (iVar1 == 0) {
        iVar1 = sigismember((sigset_t *)local_88,1);
        if (iVar1 != 0) {
          interrupted_ = 1;
        }
      }
      else {
        interrupted_ = 0xf;
      }
    }
    else {
      interrupted_ = 2;
    }
  }
  return;
}

Assistant:

void SubprocessSet::HandlePendingInterruption() {
  sigset_t pending;
  sigemptyset(&pending);
  if (sigpending(&pending) == -1) {
    perror("ninja: sigpending");
    return;
  }
  if (sigismember(&pending, SIGINT))
    interrupted_ = SIGINT;
  else if (sigismember(&pending, SIGTERM))
    interrupted_ = SIGTERM;
  else if (sigismember(&pending, SIGHUP))
    interrupted_ = SIGHUP;
}